

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

void StateApplyMove(pyhanabi_state_t *state,pyhanabi_move_t *move)

{
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x152,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if ((HanabiState *)state->state == (HanabiState *)0x0) {
    __assert_fail("state->state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x153,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if (move == (pyhanabi_move_t *)0x0) {
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x154,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
  }
  if ((HanabiMove *)move->move != (HanabiMove *)0x0) {
    hanabi_learning_env::HanabiState::ApplyMove
              ((HanabiState *)state->state,*(HanabiMove *)move->move);
    return;
  }
  __assert_fail("move->move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x155,"void StateApplyMove(pyhanabi_state_t *, pyhanabi_move_t *)");
}

Assistant:

void StateApplyMove(pyhanabi_state_t* state, pyhanabi_move_t* move) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  REQUIRE(move != nullptr);
  REQUIRE(move->move != nullptr);
  auto hanabi_state =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state);
  auto hanabi_move =
      reinterpret_cast<const hanabi_learning_env::HanabiMove*>(move->move);
  hanabi_state->ApplyMove(*hanabi_move);
}